

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::MergeWallyMap
               (wally_map *src,wally_map *dst,string *item_name,bool ignore_duplicate_error)

{
  wally_map_item *pwVar1;
  size_t __n;
  uint8_t *puVar2;
  uint8_t *dest;
  size_t dest_len;
  unsigned_long uVar3;
  pointer puVar4;
  int iVar5;
  CfdException *pCVar6;
  wally_map_item *pwVar7;
  pointer puVar8;
  long lVar9;
  size_t sVar10;
  bool bVar11;
  int ret;
  wally_map *local_b0;
  uint local_a4;
  string *local_a0;
  wally_map *local_98;
  ulong local_90;
  undefined1 local_88 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> regist_indexes;
  ByteData key;
  
  regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = 0;
  local_a4 = (uint)ignore_duplicate_error;
  local_b0 = src;
  local_a0 = item_name;
  local_98 = dst;
  do {
    puVar4 = regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (dst->num_items <= local_90) {
      puVar8 = regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        while (puVar8 != puVar4) {
          uVar3 = *puVar8;
          pwVar7 = dst->items;
          ret = wally_map_add(local_b0,pwVar7[uVar3].key,pwVar7[uVar3].key_len,pwVar7[uVar3].value,
                              pwVar7[uVar3].value_len);
          puVar8 = puVar8 + 1;
          if (ret != 0) {
            local_88._0_8_ = "cfdcore_psbt.cpp";
            local_88._8_4_ = 0x179;
            local_88._16_8_ = "MergeWallyMap";
            logger::warn<int&>((CfdSourceLocation *)local_88,"wally_map_add NG[{}]",&ret);
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &key,"psbt add ",local_a0);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&key," error.");
            CfdException::CfdException(pCVar6,kCfdMemoryFullError,(string *)local_88);
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        ret = wally_map_sort(local_b0,0);
        if (ret != 0) {
          local_88._0_8_ = "cfdcore_psbt.cpp";
          local_88._8_4_ = 0x181;
          local_88._16_8_ = "MergeWallyMap";
          logger::warn<int&>((CfdSourceLocation *)local_88,"wally_map_sort NG[{}]",&ret);
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)local_88,"psbt sort map error.",(allocator *)&key);
          CfdException::CfdException(pCVar6,kCfdInternalError,(string *)local_88);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&regist_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    pwVar7 = dst->items + local_90;
    sVar10 = local_b0->num_items;
    lVar9 = 0x18;
    while (bVar11 = sVar10 != 0, sVar10 = sVar10 - 1, bVar11) {
      pwVar1 = local_b0->items;
      __n = *(size_t *)((long)pwVar1 + lVar9 + -0x10);
      if (__n == pwVar7->key_len) {
        puVar2 = *(uint8_t **)((long)pwVar1 + lVar9 + -0x18);
        iVar5 = bcmp(puVar2,pwVar7->key,__n);
        if (iVar5 == 0) {
          ByteData::ByteData(&key,puVar2,(uint32_t)__n);
          puVar2 = *(uint8_t **)((long)pwVar1 + lVar9 + -8);
          sVar10 = *(size_t *)((long)&pwVar1->key + lVar9);
          dest = pwVar7->value;
          dest_len = pwVar7->value_len;
          ByteData::GetHex_abi_cxx11_((string *)local_88,&key);
          dst = local_98;
          ComparePsbtData(puVar2,sVar10,dest,dest_len,local_a0,(string *)local_88,SUB41(local_a4,0))
          ;
          ::std::__cxx11::string::~string((string *)local_88);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
          goto LAB_001df184;
        }
      }
      lVar9 = lVar9 + 0x20;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&regist_indexes,&local_90);
    dst = local_98;
LAB_001df184:
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void MergeWallyMap(
    struct wally_map *src, const struct wally_map *dst,
    const std::string &item_name, bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> regist_indexes;
  for (size_t dst_idx = 0; dst_idx < dst->num_items; ++dst_idx) {
    auto dst_item = &dst->items[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < src->num_items; ++src_idx) {
      auto src_item = &src->items[src_idx];
      if ((src_item->key_len == dst_item->key_len) &&
          (memcmp(src_item->key, dst_item->key, src_item->key_len) == 0)) {
        is_find = true;
        ByteData key(src_item->key, static_cast<uint32_t>(src_item->key_len));
        ComparePsbtData(
            src_item->value, src_item->value_len, dst_item->value,
            dst_item->value_len, item_name, key.GetHex(),
            ignore_duplicate_error);
        break;
      }
    }
    if (!is_find) regist_indexes.push_back(dst_idx);
  }
  if (!regist_indexes.empty()) {
    for (auto dst_idx : regist_indexes) {
      auto dst_item = &dst->items[dst_idx];
      ret = wally_map_add(
          src, dst_item->key, dst_item->key_len, dst_item->value,
          dst_item->value_len);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_map_add NG[{}]", ret);
        throw CfdException(
            kCfdMemoryFullError, "psbt add " + item_name + " error.");
      }
    }

    ret = wally_map_sort(src, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt sort map error.");
    }
  }
}